

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_array(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  int iVar1;
  cJSON *pcVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 *__s_00;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  char *__dest;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  undefined8 *puVar11;
  cJSON **ppcVar12;
  int local_38;
  
  ppcVar12 = &item->child;
  sVar7 = 0xfffffffffffffff8;
  uVar8 = 0;
  pcVar2 = (cJSON *)ppcVar12;
  do {
    pcVar2 = pcVar2->next;
    uVar8 = uVar8 - 1;
    sVar7 = sVar7 + 8;
  } while (pcVar2 != (cJSON *)0x0);
  if ((int)uVar8 == -1) {
    if (p == (printbuffer *)0x0) {
      pcVar3 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar3 = ensure(p,3);
    }
    if (pcVar3 != (char *)0x0) {
      pcVar3[2] = '\0';
      pcVar3[0] = '[';
      pcVar3[1] = ']';
      return pcVar3;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (undefined8 *)(*cJSON_malloc)(sVar7);
    if (__s_00 != (undefined8 *)0x0) {
      uVar5 = ~uVar8;
      memset(__s_00,0,sVar7);
      pcVar2 = *ppcVar12;
      puVar11 = __s_00;
      if (pcVar2 == (cJSON *)0x0) {
        sVar7 = 5;
      }
      else {
        local_38 = 3 - (uint)(fmt == 0);
        iVar6 = 5;
        puVar9 = __s_00;
        do {
          pcVar3 = print_value(pcVar2,depth + 1,fmt,(printbuffer *)0x0);
          *puVar9 = pcVar3;
          if (pcVar3 == (char *)0x0) goto LAB_001089ca;
          sVar4 = strlen(pcVar3);
          iVar6 = iVar6 + local_38 + (int)sVar4;
          if (pcVar3 == (char *)0x0) break;
          puVar9 = puVar9 + 1;
          pcVar2 = pcVar2->next;
        } while (pcVar2 != (cJSON *)0x0);
        sVar7 = (size_t)iVar6;
      }
      pcVar3 = (char *)(*cJSON_malloc)(sVar7);
      if (pcVar3 != (char *)0x0) {
        pcVar3[0] = '[';
        pcVar3[1] = '\0';
        __dest = pcVar3 + 1;
        uVar10 = 0;
        do {
          __s = (char *)__s_00[uVar10];
          sVar4 = strlen(__s);
          memcpy(__dest,__s,sVar4);
          __dest = __dest + sVar4;
          if (-(int)uVar8 - 2 != uVar10) {
            *__dest = ',';
            if (fmt == 0) {
              __dest = __dest + 1;
            }
            else {
              __dest[1] = ' ';
              __dest = __dest + 2;
            }
            *__dest = '\0';
          }
          (*cJSON_free)((void *)__s_00[uVar10]);
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
        (*cJSON_free)(__s_00);
        __dest[0] = ']';
        __dest[1] = '\0';
        return pcVar3;
      }
LAB_001089ca:
      do {
        if ((void *)*puVar11 != (void *)0x0) {
          (*cJSON_free)((void *)*puVar11);
        }
        uVar5 = uVar5 - 1;
        puVar11 = puVar11 + 1;
      } while (uVar5 != 0);
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar6 = p->offset;
    pcVar3 = ensure(p,1);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '[';
      p->offset = p->offset + 1;
      pcVar2 = *ppcVar12;
      if (pcVar2 != (cJSON *)0x0) {
        do {
          print_value(pcVar2,depth + 1,fmt,p);
          iVar1 = 0;
          if (p->buffer != (char *)0x0) {
            iVar1 = p->offset;
            sVar4 = strlen(p->buffer + iVar1);
            iVar1 = (int)sVar4 + iVar1;
          }
          p->offset = iVar1;
          if (pcVar2->next == (cJSON *)0x0) break;
          pcVar3 = ensure(p,fmt == 0 ^ 3);
          if (pcVar3 == (char *)0x0) {
            return (char *)0x0;
          }
          *pcVar3 = ',';
          if (fmt == 0) {
            pcVar3 = pcVar3 + 1;
          }
          else {
            pcVar3[1] = ' ';
            pcVar3 = pcVar3 + 2;
          }
          *pcVar3 = '\0';
          p->offset = p->offset + (2 - (uint)(fmt == 0));
          pcVar2 = pcVar2->next;
        } while (pcVar2 != (cJSON *)0x0);
      }
      pcVar3 = ensure(p,2);
      if (pcVar3 != (char *)0x0) {
        pcVar3[0] = ']';
        pcVar3[1] = '\0';
        return p->buffer + iVar6;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_array(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries;
	char *out=0,*ptr,*ret;int len=5;
	cJSON *child=item->child;
	int numentries=0,i=0,fail=0;
	size_t tmplen=0;
	
	/* How many entries in the array? */
	while (child) numentries++,child=child->next;
	/* Explicitly handle numentries==0 */
	if (!numentries)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (out) strcpy(out,"[]");
		return out;
	}

	if (p)
	{
		/* Compose the output array. */
		i=p->offset;
		ptr=ensure(p,1);if (!ptr) return 0;	*ptr='[';	p->offset++;
		child=item->child;
		while (child && !fail)
		{
			print_value(child,depth+1,fmt,p);
			p->offset=update(p);
			if (child->next) {len=fmt?2:1;ptr=ensure(p,len+1);if (!ptr) return 0;*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;p->offset+=len;}
			child=child->next;
		}
		ptr=ensure(p,2);if (!ptr) return 0;	*ptr++=']';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate an array to hold the values for each */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		memset(entries,0,numentries*sizeof(char*));
		/* Retrieve all the results: */
		child=item->child;
		while (child && !fail)
		{
			ret=print_value(child,depth+1,fmt,0);
			entries[i++]=ret;
			if (ret) len+=strlen(ret)+2+(fmt?1:0); else fail=1;
			child=child->next;
		}
		
		/* If we didn't fail, try to malloc the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		/* If that fails, we fail. */
		if (!out) fail=1;

		/* Handle failure. */
		if (fail)
		{
			for (i=0;i<numentries;i++) if (entries[i]) cJSON_free(entries[i]);
			cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output array. */
		*out='[';
		ptr=out+1;*ptr=0;
		for (i=0;i<numentries;i++)
		{
			tmplen=strlen(entries[i]);memcpy(ptr,entries[i],tmplen);ptr+=tmplen;
			if (i!=numentries-1) {*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;}
			cJSON_free(entries[i]);
		}
		cJSON_free(entries);
		*ptr++=']';*ptr++=0;
	}
	return out;	
}